

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  size_type sVar1;
  char cVar2;
  ostream *poVar3;
  int iVar4;
  LagrangePolynomial lp;
  int n;
  vector<int,_std::allocator<int>_> data_x;
  vector<int,_std::allocator<int>_> data_y;
  string path;
  vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_> results;
  vector<poly,_std::allocator<poly>_> basis_p;
  BasisPolynomial bp;
  LagrangePolynomial local_20d;
  int local_20c;
  vector<int,_std::allocator<int>_> local_208;
  vector<int,_std::allocator<int>_> local_1e8;
  string local_1d0;
  vector<poly,_std::allocator<poly>_> local_1b0;
  vector<int,_std::allocator<int>_> local_198;
  vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_> local_180;
  vector<poly,_std::allocator<poly>_> local_168;
  vector<int,_std::allocator<int>_> local_150;
  BasisPolynomial local_138 [11];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter number of terms(n): ",0x1a);
  std::istream::operator>>((istream *)&std::cin,&local_20c);
  if (local_20c < 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"That\'s Invalid. Please don\'t mess around :-(",0x2c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
  }
  else {
    local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (int *)0x0;
    local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (int *)0x0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Enter the first n terms of the series: ",0x27);
    if (0 < local_20c) {
      iVar4 = 0;
      do {
        std::istream::operator>>((istream *)&std::cin,(int *)local_138);
        if (local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_1e8,
                     (iterator)
                     local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)local_138);
        }
        else {
          *local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = (int)local_138[0].data_points.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start;
          local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        iVar4 = iVar4 + 1;
        local_1d0._M_dataplus._M_p._0_4_ = iVar4;
        if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_208,
                     (iterator)
                     local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_1d0);
        }
        else {
          *local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar4;
          local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      } while (iVar4 < local_20c);
    }
    local_1d0._M_string_length = 0;
    local_1d0.field_2._M_local_buf[0] = '\0';
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Enter destination for source files [Current folder if empty]:"
               ,0x3d);
    std::istream::ignore();
    cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + 'X');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_1d0,cVar2);
    if ((char *)local_1d0._M_string_length == (char *)0x0) {
      getcwd((char *)local_138,0xff);
      sVar1 = local_1d0._M_string_length;
      strlen((char *)local_138);
      std::__cxx11::string::_M_replace((ulong)&local_1d0,0,(char *)sVar1,(ulong)local_138);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Using path: ",0xc);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_1d0._M_dataplus._M_p,local_1d0._M_string_length)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::vector<int,_std::allocator<int>_>::vector(&local_150,&local_208);
    BasisPolynomial::BasisPolynomial(local_138,&local_150);
    if (local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_150.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    BasisPolynomial::get_all_basis_polynomials(&local_168,local_138);
    std::vector<int,_std::allocator<int>_>::vector(&local_198,&local_1e8);
    std::vector<poly,_std::allocator<poly>_>::vector(&local_1b0,&local_168);
    LagrangePolynomial::get_lagrange_polynomial(&local_180,&local_20d,&local_198,&local_1b0);
    std::vector<poly,_std::allocator<poly>_>::~vector(&local_1b0);
    if (local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    generate_all_programs(&local_180,&local_1d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nDone. May the force be with you :-)",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    std::vector<LagrangePolynomial::element,_std::allocator<LagrangePolynomial::element>_>::~vector
              (&local_180);
    std::vector<poly,_std::allocator<poly>_>::~vector(&local_168);
    if ((void *)CONCAT44(local_138[0].data_points.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,
                         (int)local_138[0].data_points.super__Vector_base<int,_std::allocator<int>_>
                              ._M_impl.super__Vector_impl_data._M_start) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_138[0].data_points.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start._4_4_,
                                       (int)local_138[0].data_points.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    if (local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_208.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return 0;
}

Assistant:

int main() {
    int n;
    cout << "Enter number of terms(n): ";
    cin >> n ;

    if(n<=0){ // If the user enters a character, it will still be 0
        cout << "That's Invalid. Please don't mess around :-(" << endl;
        return 0;
    }

    vector<int> data_y; // f(x)
    vector<int> data_x; // x

    cout << "Enter the first n terms of the series: ";
    for(int i=0; i<n; i++){
        int k;
        cin >> k;
        data_y.push_back(k);
        data_x.push_back(i+1);
    }

    string path;
    cout << "Enter destination for source files [Current folder if empty]:";

    cin.ignore();
    getline(cin,path);
    if (path.empty()){
        char pwd[256];
        getcwd(pwd, 255);
        path = pwd;
    }
    cout << "Using path: " << path << endl;

    BasisPolynomial bp(data_x); // generating basis polynomials
    vector<poly> basis_p = bp.get_all_basis_polynomials();

    LagrangePolynomial lp; // generating the lagrange polynomial
    vector<LagrangePolynomial::element> results = lp.get_lagrange_polynomial(data_y,basis_p);

    generate_all_programs(results,path);
    cout << "\nDone. May the force be with you :-)" << endl;

    return 0;
}